

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFNumberTreeObjectHelper.cc
# Opt level: O1

int __thiscall QPDFNumberTreeObjectHelper::remove(QPDFNumberTreeObjectHelper *this,char *__filename)

{
  NNTreeImpl *this_00;
  int iVar1;
  QPDFObjectHandle QStack_28;
  
  this_00 = (((this->m).
              super___shared_ptr<QPDFNumberTreeObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->impl).super___shared_ptr<NNTreeImpl,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  QPDFObjectHandle::newInteger(&QStack_28,(longlong)__filename);
  iVar1 = NNTreeImpl::remove(this_00,(char *)&QStack_28);
  if (QStack_28.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (QStack_28.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  return iVar1;
}

Assistant:

bool
QPDFNumberTreeObjectHelper::remove(numtree_number key, QPDFObjectHandle* value)
{
    return m->impl->remove(QPDFObjectHandle::newInteger(key), value);
}